

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<kj::Own<kj::NetworkAddress>_> __thiscall
kj::anon_unknown_0::ConnectionCountingNetwork::parseAddress
          (ConnectionCountingNetwork *this,StringPtr addr,uint portHint)

{
  undefined4 in_register_0000000c;
  PromiseNode *extraout_RDX;
  char *pcVar1;
  undefined4 in_R8D;
  undefined8 in_R9;
  Promise<kj::Own<kj::NetworkAddress>_> PVar2;
  ConnectionCountingNetwork *pCVar3;
  char *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  uint uStack_50;
  Promise<kj::Own<kj::NetworkAddress>_> local_40;
  char *pcStack_28;
  uint portHint_local;
  ConnectionCountingNetwork *this_local;
  StringPtr addr_local;
  
  addr_local.content.ptr = (char *)CONCAT44(in_register_0000000c,portHint);
  pcVar1 = addr.content.ptr;
  **(int **)(pcVar1 + 0x18) = **(int **)(pcVar1 + 0x18) + 1;
  this_local._0_4_ = (undefined4)addr.content.size_;
  this_local._4_4_ = addr.content.size_._4_4_;
  local_58 = this_local._0_4_;
  uStack_54 = this_local._4_4_;
  pCVar3 = this;
  uStack_50 = portHint;
  pcStack_28 = pcVar1;
  this_local = (ConnectionCountingNetwork *)addr.content.size_;
  addr_local.content.size_ = (size_t)this;
  (**(code **)**(undefined8 **)(pcVar1 + 8))
            (&local_40,*(undefined8 **)(pcVar1 + 8),(ConnectionCountingNetwork *)addr.content.size_,
             CONCAT44(in_register_0000000c,portHint),in_R8D,in_R9,this,pcVar1);
  local_60 = pcVar1;
  Promise<kj::Own<kj::NetworkAddress>>::
  then<kj::(anonymous_namespace)::ConnectionCountingNetwork::parseAddress(kj::StringPtr,unsigned_int)::_lambda(kj::Own<kj::NetworkAddress>&&)_1_,kj::_::PropagateException>
            ((Promise<kj::Own<kj::NetworkAddress>> *)this,(Type *)&local_40,
             (PropagateException *)&local_60);
  Promise<kj::Own<kj::NetworkAddress>_>::~Promise(&local_40);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)pCVar3;
  return (Promise<kj::Own<kj::NetworkAddress>_>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<Own<NetworkAddress>> parseAddress(StringPtr addr, uint portHint = 0) override {
    ++addrCount;
    return inner.parseAddress(addr, portHint)
        .then([this](Own<NetworkAddress>&& addr) -> Own<NetworkAddress> {
      return kj::heap<CountingNetworkAddress>(kj::mv(addr), count, addrCount);
    });
  }